

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
SettingToString_abi_cxx11_(SettingsValue *value)

{
  long lVar1;
  bool bVar2;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *in_stack_ffffffffffffffc8;
  UniValue *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  bVar2 = UniValue::isNull(in_stack_ffffffffffffffc8);
  if (bVar2) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_RDI);
  }
  else {
    bVar2 = UniValue::isFalse(this);
    if (bVar2) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<const_char_(&)[2],_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,(char (*) [2])in_RDI);
    }
    else {
      bVar2 = UniValue::isTrue(this);
      if (bVar2) {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<const_char_(&)[2],_true>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,(char (*) [2])in_RDI);
      }
      else {
        bVar2 = UniValue::isNum(in_stack_ffffffffffffffc8);
        if (bVar2) {
          UniValue::getValStr_abi_cxx11_(in_stack_ffffffffffffffc8);
          wallet::_GLOBAL__N_1::std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_RDI);
        }
        else {
          UniValue::get_str_abi_cxx11_(in_RDI);
          wallet::_GLOBAL__N_1::std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_RDI);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)this;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> SettingToString(const common::SettingsValue& value)
{
    if (value.isNull()) return std::nullopt;
    if (value.isFalse()) return "0";
    if (value.isTrue()) return "1";
    if (value.isNum()) return value.getValStr();
    return value.get_str();
}